

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xmlXPathCompOpEval(xmlXPathParserContextPtr ctxt,xmlXPathStepOpPtr op)

{
  xmlXPathCompExprPtr pxVar1;
  xmlXPathStepOp *pxVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  xmlXPathOp xVar6;
  int iVar7;
  xmlXPathContextPtr pxVar8;
  long lVar9;
  xmlXPathObjectPtr obj;
  xmlNodeSetPtr pxVar10;
  xmlXPathObjectPtr pxVar11;
  xmlChar *pxVar12;
  xmlXPathFunction p_Var13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  xmlNodePtr first;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if (ctxt->error != 0) {
    return 0;
  }
  pxVar8 = ctxt->context;
  if (pxVar8->opLimit != 0) {
    iVar4 = xmlXPathCheckOpLimit(ctxt,1);
    if (iVar4 < 0) {
      return 0;
    }
    pxVar8 = ctxt->context;
  }
  if (4999 < pxVar8->depth) {
    iVar4 = 0x1a;
    goto LAB_001bb915;
  }
  pxVar8->depth = pxVar8->depth + 1;
  xVar6 = op->op;
  if (XPATH_OP_SORT < xVar6) {
    iVar4 = 10;
    goto LAB_001bb915;
  }
  pxVar1 = ctxt->comp;
  switch(xVar6) {
  case XPATH_OP_END:
    break;
  case XPATH_OP_AND:
    xVar6 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
    if (ctxt->error != 0) {
      return 0;
    }
    xmlXPathBooleanFunction(ctxt,1);
    if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->boolval == 0)) break;
    pxVar11 = valuePop(ctxt);
    iVar4 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch2);
    xVar6 = xVar6 + iVar4;
    if (ctxt->error == 0) {
      xmlXPathBooleanFunction(ctxt,1);
      if (ctxt->value != (xmlXPathObjectPtr)0x0) {
        piVar3 = &ctxt->value->boolval;
        *piVar3 = *piVar3 & pxVar11->boolval;
      }
LAB_001bc170:
      pxVar8 = ctxt->context;
      goto LAB_001bc177;
    }
    goto LAB_001bbd8f;
  case XPATH_OP_OR:
    xVar6 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
    if (ctxt->error != 0) {
      return 0;
    }
    xmlXPathBooleanFunction(ctxt,1);
    if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->boolval == 1)) break;
    pxVar11 = valuePop(ctxt);
    iVar4 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch2);
    xVar6 = xVar6 + iVar4;
    if (ctxt->error == 0) {
      xmlXPathBooleanFunction(ctxt,1);
      if (ctxt->value != (xmlXPathObjectPtr)0x0) {
        piVar3 = &ctxt->value->boolval;
        *piVar3 = *piVar3 | pxVar11->boolval;
      }
      goto LAB_001bc170;
    }
LAB_001bbd8f:
    xmlXPathFreeObject(pxVar11);
    break;
  case XPATH_OP_EQUAL:
    iVar7 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
    if (ctxt->error != 0) {
      return 0;
    }
    iVar5 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch2);
    if (ctxt->error != 0) {
      return 0;
    }
    if (op->value == 0) {
      iVar4 = xmlXPathNotEqualValues(ctxt);
    }
    else {
      iVar4 = xmlXPathEqualValues(ctxt);
    }
    xVar6 = iVar5 + iVar7;
    goto LAB_001bc189;
  case XPATH_OP_CMP:
    iVar4 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
    if (ctxt->error != 0) {
      return 0;
    }
    iVar7 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch2);
    if (ctxt->error != 0) {
      return 0;
    }
    xVar6 = iVar7 + iVar4;
    iVar4 = xmlXPathCompareValues(ctxt,op->value,op->value2);
LAB_001bc189:
    pxVar11 = xmlXPathCacheNewBoolean(ctxt,iVar4);
    goto LAB_001bc199;
  case XPATH_OP_PLUS:
    xVar6 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
    if (ctxt->error != 0) {
      return 0;
    }
    if ((long)op->ch2 != -1) {
      iVar4 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch2);
      if (ctxt->error != 0) {
        return 0;
      }
      xVar6 = iVar4 + xVar6;
    }
    switch(op->value) {
    case 0:
      xmlXPathSubValues(ctxt);
      break;
    case 1:
      xmlXPathAddValues(ctxt);
      break;
    case 2:
      xmlXPathValueFlipSign(ctxt);
      break;
    case 3:
      if (ctxt->value != (xmlXPathObjectPtr)0x0) {
        if (ctxt->value->type == XPATH_NUMBER) break;
        xmlXPathNumberFunction(ctxt,1);
        if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type == XPATH_NUMBER)) break;
      }
      goto LAB_001bc108;
    }
    break;
  case XPATH_OP_MULT:
    iVar4 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
    if (ctxt->error != 0) {
      return 0;
    }
    iVar7 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch2);
    if (ctxt->error != 0) {
      return 0;
    }
    xVar6 = iVar7 + iVar4;
    iVar4 = op->value;
    if (iVar4 == 2) {
      xmlXPathModValues(ctxt);
    }
    else if (iVar4 == 1) {
      xmlXPathDivValues(ctxt);
    }
    else if (iVar4 == 0) {
      xmlXPathMultValues(ctxt);
    }
    break;
  case XPATH_OP_UNION:
    iVar4 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
    if (ctxt->error != 0) {
      return 0;
    }
    iVar7 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch2);
    if (ctxt->error != 0) {
      return 0;
    }
    pxVar11 = valuePop(ctxt);
    obj = valuePop(ctxt);
    if (((obj != (xmlXPathObjectPtr)0x0) &&
        (pxVar11 != (xmlXPathObjectPtr)0x0 && obj->type == XPATH_NODESET)) &&
       (pxVar11->type == XPATH_NODESET)) {
      xVar6 = iVar7 + iVar4;
      if ((ctxt->context->opLimit == 0) ||
         (((obj->nodesetval == (xmlNodeSetPtr)0x0 ||
           (iVar4 = xmlXPathCheckOpLimit(ctxt,(long)obj->nodesetval->nodeNr), -1 < iVar4)) &&
          ((pxVar11->nodesetval == (xmlNodeSetPtr)0x0 ||
           (iVar4 = xmlXPathCheckOpLimit(ctxt,(long)pxVar11->nodesetval->nodeNr), -1 < iVar4)))))) {
        pxVar10 = pxVar11->nodesetval;
        if ((pxVar10 != (xmlNodeSetPtr)0x0) && (pxVar10->nodeNr != 0)) {
          pxVar10 = xmlXPathNodeSetMerge(obj->nodesetval,pxVar10);
          obj->nodesetval = pxVar10;
          if (pxVar10 == (xmlNodeSetPtr)0x0) {
            xmlXPathPErrMemory(ctxt);
          }
        }
        valuePush(ctxt,obj);
      }
      else {
        xmlXPathReleaseObject(ctxt->context,obj);
      }
      pxVar8 = ctxt->context;
LAB_001bc177:
      xmlXPathReleaseObject(pxVar8,pxVar11);
      break;
    }
    xmlXPathReleaseObject(ctxt->context,obj);
    xmlXPathReleaseObject(ctxt->context,pxVar11);
LAB_001bc108:
    iVar4 = 0xb;
LAB_001bb915:
    xmlXPathErr(ctxt,iVar4);
    return 0;
  case XPATH_OP_ROOT:
    xmlXPathRoot(ctxt);
    goto LAB_001bbf68;
  case XPATH_OP_NODE:
    xVar6 = XPATH_OP_END;
    if ((long)op->ch1 != -1) {
      xVar6 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
    }
    if (ctxt->error != 0) {
      return 0;
    }
    if ((long)op->ch2 != -1) {
      iVar4 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch2);
      if (ctxt->error != 0) {
        return 0;
      }
      xVar6 = iVar4 + xVar6;
    }
    pxVar11 = xmlXPathCacheNewNodeSet(ctxt,ctxt->context->node);
    goto LAB_001bc199;
  case XPATH_OP_COLLECT:
    if ((long)op->ch1 != -1) {
      iVar4 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
      if (ctxt->error != 0) {
        return 0;
      }
      iVar7 = xmlXPathNodeCollectAndTest(ctxt,op,(xmlNodePtr *)0x0,(xmlNodePtr *)0x0,0);
      xVar6 = iVar7 + iVar4;
      break;
    }
    goto LAB_001bbf68;
  case XPATH_OP_VALUE:
    pxVar11 = xmlXPathCacheObjectCopy(ctxt,(xmlXPathObjectPtr)op->value4);
    valuePush(ctxt,pxVar11);
LAB_001bbf68:
    xVar6 = XPATH_OP_END;
    break;
  case XPATH_OP_VARIABLE:
    if ((long)op->ch1 == -1) {
      xVar6 = XPATH_OP_END;
    }
    else {
      xVar6 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
    }
    if ((xmlChar *)op->value5 == (xmlChar *)0x0) {
      pxVar11 = xmlXPathVariableLookup(ctxt->context,(xmlChar *)op->value4);
    }
    else {
      pxVar12 = xmlXPathNsLookup(ctxt->context,(xmlChar *)op->value5);
      if (pxVar12 == (xmlChar *)0x0) {
LAB_001bc142:
        iVar4 = 0x13;
        goto LAB_001bc144;
      }
      pxVar11 = xmlXPathVariableLookupNS(ctxt->context,(xmlChar *)op->value4,pxVar12);
    }
    if (pxVar11 == (xmlXPathObjectPtr)0x0) {
      iVar4 = 5;
      goto LAB_001bc144;
    }
    goto LAB_001bc199;
  case XPATH_OP_FUNCTION:
    iVar4 = ctxt->valueNr;
    if ((long)op->ch1 == -1) {
      xVar6 = XPATH_OP_END;
      iVar7 = iVar4;
    }
    else {
      xVar6 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
      if (ctxt->error != 0) break;
      iVar7 = ctxt->valueNr;
    }
    uVar16 = op->value;
    if ((int)(uVar16 + iVar4) <= iVar7) {
      uVar15 = 0;
      if (0 < (int)uVar16) {
        uVar15 = (ulong)uVar16;
      }
      do {
        iVar7 = iVar7 + -1;
        if (uVar15 == 0) {
          p_Var13 = op->cache;
          if (p_Var13 == (xmlXPathFunction)0x0) {
            if ((xmlChar *)op->value5 == (xmlChar *)0x0) {
              p_Var13 = xmlXPathFunctionLookup(ctxt->context,(xmlChar *)op->value4);
              pxVar12 = (xmlChar *)0x0;
            }
            else {
              pxVar12 = xmlXPathNsLookup(ctxt->context,(xmlChar *)op->value5);
              if (pxVar12 == (xmlChar *)0x0) goto LAB_001bc142;
              p_Var13 = xmlXPathFunctionLookupNS(ctxt->context,(xmlChar *)op->value4,pxVar12);
            }
            if (p_Var13 == (xmlXPathFunction)0x0) {
              iVar4 = 9;
              goto LAB_001bc144;
            }
            op->cache = p_Var13;
            op->cacheURI = pxVar12;
            uVar16 = op->value;
          }
          else {
            pxVar12 = (xmlChar *)op->cacheURI;
          }
          pxVar8 = ctxt->context;
          local_48 = *(undefined4 *)&pxVar8->function;
          uStack_44 = *(undefined4 *)((long)&pxVar8->function + 4);
          uStack_40 = *(undefined4 *)&pxVar8->functionURI;
          uStack_3c = *(undefined4 *)((long)&pxVar8->functionURI + 4);
          pxVar8->function = (xmlChar *)op->value4;
          pxVar8->functionURI = pxVar12;
          (*p_Var13)(ctxt,uVar16);
          pxVar8 = ctxt->context;
          pxVar8->function = (xmlChar *)CONCAT44(uStack_44,local_48);
          pxVar8->functionURI = (xmlChar *)CONCAT44(uStack_3c,uStack_40);
          if ((ctxt->error != 0) || (ctxt->valueNr == iVar4 + 1)) goto switchD_001bb947_caseD_0;
          iVar4 = 0x17;
          goto LAB_001bc144;
        }
        uVar15 = uVar15 - 1;
      } while (ctxt->valueTab[iVar7] != (xmlXPathObjectPtr)0x0);
    }
    iVar4 = 10;
LAB_001bc144:
    xmlXPathErr(ctxt,iVar4);
    return 0;
  case XPATH_OP_ARG:
    if ((long)op->ch1 == -1) {
      xVar6 = XPATH_OP_END;
    }
    else {
      xVar6 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
      if (ctxt->error != 0) {
        return 0;
      }
    }
    if ((long)op->ch2 != -1) {
      iVar4 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch2);
      if (ctxt->error != 0) {
        return 0;
      }
      xVar6 = iVar4 + xVar6;
    }
    break;
  default:
    iVar4 = op->ch1;
    lVar14 = (long)iVar4;
    xVar6 = XPATH_OP_END;
    if (lVar14 != -1) {
      lVar9 = (long)op->ch2;
      if (lVar9 != -1) {
        pxVar2 = pxVar1->steps;
        if (((((pxVar2[lVar14].op & ~XPATH_OP_AND) == XPATH_OP_FILTER) &&
             (pxVar2[lVar9].op == XPATH_OP_VALUE)) &&
            ((piVar3 = (int *)pxVar2[lVar9].value4, piVar3 != (int *)0x0 &&
             ((*piVar3 == 3 && (*(double *)(piVar3 + 6) == 1.0)))))) &&
           (!NAN(*(double *)(piVar3 + 6)))) {
          first = (xmlNodePtr)0x0;
          xVar6 = xmlXPathCompOpEvalFirst(ctxt,pxVar2 + lVar14,&first);
          if (ctxt->error == 0) {
            pxVar11 = ctxt->value;
            iVar4 = 2;
            if ((((pxVar11 != (xmlXPathObjectPtr)0x0) && (pxVar11->type == XPATH_NODESET)) &&
                (pxVar10 = pxVar11->nodesetval, pxVar10 != (xmlNodeSetPtr)0x0)) &&
               (1 < pxVar10->nodeNr)) {
              xmlXPathNodeSetClearFromPos(pxVar10,1,1);
            }
          }
          else {
LAB_001bb9e5:
            iVar4 = 1;
          }
LAB_001bb9e8:
          if (iVar4 != 2) {
            return 0;
          }
          break;
        }
        pxVar2 = pxVar1->steps;
        if (((pxVar2[lVar14].op == XPATH_OP_SORT) && (pxVar2[lVar9].op == XPATH_OP_SORT)) &&
           ((((lVar14 = (long)pxVar2[lVar9].ch1, lVar14 != -1 &&
              ((pxVar2[lVar14].op == XPATH_OP_FUNCTION && (pxVar2[lVar14].value5 == (void *)0x0))))
             && (pxVar2[lVar14].value == 0)) && ((xmlChar *)pxVar2[lVar14].value4 != (xmlChar *)0x0)
            ))) {
          iVar7 = xmlStrEqual((xmlChar *)pxVar2[lVar14].value4,(xmlChar *)"last");
          iVar4 = op->ch1;
          if (iVar7 != 0) {
            first = (xmlNodePtr)0x0;
            xVar6 = xmlXPathCompOpEvalLast(ctxt,pxVar1->steps + iVar4,&first);
            if (ctxt->error != 0) goto LAB_001bb9e5;
            pxVar11 = ctxt->value;
            iVar4 = 2;
            if ((((pxVar11 != (xmlXPathObjectPtr)0x0) && (pxVar11->type == XPATH_NODESET)) &&
                (pxVar10 = pxVar11->nodesetval, pxVar10 != (xmlNodeSetPtr)0x0)) &&
               ((pxVar10->nodeTab != (xmlNodePtr *)0x0 && (1 < pxVar10->nodeNr)))) {
              xmlXPathNodeSetKeepLast(pxVar10);
            }
            goto LAB_001bb9e8;
          }
          xVar6 = XPATH_OP_END;
          if (iVar4 == -1) goto LAB_001bbfcc;
        }
      }
      xVar6 = xmlXPathCompOpEval(ctxt,pxVar1->steps + iVar4);
    }
LAB_001bbfcc:
    if (ctxt->error != 0) {
      return 0;
    }
    if ((op->ch2 == -1) || (ctxt->value == (xmlXPathObjectPtr)0x0)) break;
    if (ctxt->value->type != XPATH_NODESET) goto LAB_001bc108;
    pxVar11 = valuePop(ctxt);
    pxVar10 = pxVar11->nodesetval;
    if (pxVar10 != (xmlNodeSetPtr)0x0) {
      xmlXPathNodeSetFilter(ctxt,pxVar10,op->ch2,1,pxVar10->nodeNr,1);
    }
LAB_001bc199:
    valuePush(ctxt,pxVar11);
    break;
  case XPATH_OP_SORT:
    xVar6 = XPATH_OP_END;
    if ((long)op->ch1 != -1) {
      xVar6 = xmlXPathCompOpEval(ctxt,pxVar1->steps + op->ch1);
    }
    if (ctxt->error != 0) {
      return 0;
    }
    pxVar11 = ctxt->value;
    if ((((pxVar11 != (xmlXPathObjectPtr)0x0) && (pxVar11->type == XPATH_NODESET)) &&
        (pxVar10 = pxVar11->nodesetval, pxVar10 != (xmlNodeSetPtr)0x0)) && (1 < pxVar10->nodeNr)) {
      xmlXPathNodeSetSort(pxVar10);
    }
  }
switchD_001bb947_caseD_0:
  piVar3 = &ctxt->context->depth;
  *piVar3 = *piVar3 + -1;
  return xVar6;
}

Assistant:

static int
xmlXPathCompOpEval(xmlXPathParserContextPtr ctxt, xmlXPathStepOpPtr op)
{
    int total = 0;
    int equal, ret;
    xmlXPathCompExprPtr comp;
    xmlXPathObjectPtr arg1, arg2;

    CHECK_ERROR0;
    if (OP_LIMIT_EXCEEDED(ctxt, 1))
        return(0);
    if (ctxt->context->depth >= XPATH_MAX_RECURSION_DEPTH)
        XP_ERROR0(XPATH_RECURSION_LIMIT_EXCEEDED);
    ctxt->context->depth += 1;
    comp = ctxt->comp;
    switch (op->op) {
        case XPATH_OP_END:
            break;
        case XPATH_OP_AND:
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            xmlXPathBooleanFunction(ctxt, 1);
            if ((ctxt->value == NULL) || (ctxt->value->boolval == 0))
                break;
            arg2 = valuePop(ctxt);
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    if (ctxt->error) {
		xmlXPathFreeObject(arg2);
		break;
	    }
            xmlXPathBooleanFunction(ctxt, 1);
            if (ctxt->value != NULL)
                ctxt->value->boolval &= arg2->boolval;
	    xmlXPathReleaseObject(ctxt->context, arg2);
            break;
        case XPATH_OP_OR:
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            xmlXPathBooleanFunction(ctxt, 1);
            if ((ctxt->value == NULL) || (ctxt->value->boolval == 1))
                break;
            arg2 = valuePop(ctxt);
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    if (ctxt->error) {
		xmlXPathFreeObject(arg2);
		break;
	    }
            xmlXPathBooleanFunction(ctxt, 1);
            if (ctxt->value != NULL)
                ctxt->value->boolval |= arg2->boolval;
	    xmlXPathReleaseObject(ctxt->context, arg2);
            break;
        case XPATH_OP_EQUAL:
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    CHECK_ERROR0;
	    if (op->value)
		equal = xmlXPathEqualValues(ctxt);
	    else
		equal = xmlXPathNotEqualValues(ctxt);
	    valuePush(ctxt, xmlXPathCacheNewBoolean(ctxt, equal));
            break;
        case XPATH_OP_CMP:
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    CHECK_ERROR0;
            ret = xmlXPathCompareValues(ctxt, op->value, op->value2);
	    valuePush(ctxt, xmlXPathCacheNewBoolean(ctxt, ret));
            break;
        case XPATH_OP_PLUS:
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            if (op->ch2 != -1) {
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    }
	    CHECK_ERROR0;
            if (op->value == 0)
                xmlXPathSubValues(ctxt);
            else if (op->value == 1)
                xmlXPathAddValues(ctxt);
            else if (op->value == 2)
                xmlXPathValueFlipSign(ctxt);
            else if (op->value == 3) {
                CAST_TO_NUMBER;
                CHECK_TYPE0(XPATH_NUMBER);
            }
            break;
        case XPATH_OP_MULT:
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    CHECK_ERROR0;
            if (op->value == 0)
                xmlXPathMultValues(ctxt);
            else if (op->value == 1)
                xmlXPathDivValues(ctxt);
            else if (op->value == 2)
                xmlXPathModValues(ctxt);
            break;
        case XPATH_OP_UNION:
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    CHECK_ERROR0;

            arg2 = valuePop(ctxt);
            arg1 = valuePop(ctxt);
            if ((arg1 == NULL) || (arg1->type != XPATH_NODESET) ||
                (arg2 == NULL) || (arg2->type != XPATH_NODESET)) {
	        xmlXPathReleaseObject(ctxt->context, arg1);
	        xmlXPathReleaseObject(ctxt->context, arg2);
                XP_ERROR0(XPATH_INVALID_TYPE);
            }
            if ((ctxt->context->opLimit != 0) &&
                (((arg1->nodesetval != NULL) &&
                  (xmlXPathCheckOpLimit(ctxt,
                                        arg1->nodesetval->nodeNr) < 0)) ||
                 ((arg2->nodesetval != NULL) &&
                  (xmlXPathCheckOpLimit(ctxt,
                                        arg2->nodesetval->nodeNr) < 0)))) {
	        xmlXPathReleaseObject(ctxt->context, arg1);
	        xmlXPathReleaseObject(ctxt->context, arg2);
                break;
            }

	    if (((arg2->nodesetval != NULL) &&
		 (arg2->nodesetval->nodeNr != 0)))
	    {
		arg1->nodesetval = xmlXPathNodeSetMerge(arg1->nodesetval,
							arg2->nodesetval);
                if (arg1->nodesetval == NULL)
                    xmlXPathPErrMemory(ctxt);
	    }

            valuePush(ctxt, arg1);
	    xmlXPathReleaseObject(ctxt->context, arg2);
            break;
        case XPATH_OP_ROOT:
            xmlXPathRoot(ctxt);
            break;
        case XPATH_OP_NODE:
            if (op->ch1 != -1)
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            if (op->ch2 != -1)
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    CHECK_ERROR0;
	    valuePush(ctxt, xmlXPathCacheNewNodeSet(ctxt,
                                                    ctxt->context->node));
            break;
        case XPATH_OP_COLLECT:{
                if (op->ch1 == -1)
                    break;

                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
		CHECK_ERROR0;

                total += xmlXPathNodeCollectAndTest(ctxt, op, NULL, NULL, 0);
                break;
            }
        case XPATH_OP_VALUE:
            valuePush(ctxt, xmlXPathCacheObjectCopy(ctxt, op->value4));
            break;
        case XPATH_OP_VARIABLE:{
		xmlXPathObjectPtr val;

                if (op->ch1 != -1)
                    total +=
                        xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
                if (op->value5 == NULL) {
		    val = xmlXPathVariableLookup(ctxt->context, op->value4);
		    if (val == NULL)
			XP_ERROR0(XPATH_UNDEF_VARIABLE_ERROR);
                    valuePush(ctxt, val);
		} else {
                    const xmlChar *URI;

                    URI = xmlXPathNsLookup(ctxt->context, op->value5);
                    if (URI == NULL) {
                        XP_ERROR0(XPATH_UNDEF_PREFIX_ERROR);
                        break;
                    }
		    val = xmlXPathVariableLookupNS(ctxt->context,
                                                       op->value4, URI);
		    if (val == NULL)
			XP_ERROR0(XPATH_UNDEF_VARIABLE_ERROR);
                    valuePush(ctxt, val);
                }
                break;
            }
        case XPATH_OP_FUNCTION:{
                xmlXPathFunction func;
                const xmlChar *oldFunc, *oldFuncURI;
		int i;
                int frame;

                frame = ctxt->valueNr;
                if (op->ch1 != -1) {
                    total +=
                        xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
                    if (ctxt->error != XPATH_EXPRESSION_OK)
                        break;
                }
		if (ctxt->valueNr < frame + op->value)
		    XP_ERROR0(XPATH_INVALID_OPERAND);
		for (i = 0; i < op->value; i++) {
		    if (ctxt->valueTab[(ctxt->valueNr - 1) - i] == NULL)
			XP_ERROR0(XPATH_INVALID_OPERAND);
                }
                if (op->cache != NULL)
                    func = op->cache;
                else {
                    const xmlChar *URI = NULL;

                    if (op->value5 == NULL)
                        func =
                            xmlXPathFunctionLookup(ctxt->context,
                                                   op->value4);
                    else {
                        URI = xmlXPathNsLookup(ctxt->context, op->value5);
                        if (URI == NULL)
                            XP_ERROR0(XPATH_UNDEF_PREFIX_ERROR);
                        func = xmlXPathFunctionLookupNS(ctxt->context,
                                                        op->value4, URI);
                    }
                    if (func == NULL)
                        XP_ERROR0(XPATH_UNKNOWN_FUNC_ERROR);
                    op->cache = func;
                    op->cacheURI = (void *) URI;
                }
                oldFunc = ctxt->context->function;
                oldFuncURI = ctxt->context->functionURI;
                ctxt->context->function = op->value4;
                ctxt->context->functionURI = op->cacheURI;
                func(ctxt, op->value);
                ctxt->context->function = oldFunc;
                ctxt->context->functionURI = oldFuncURI;
                if ((ctxt->error == XPATH_EXPRESSION_OK) &&
                    (ctxt->valueNr != frame + 1))
                    XP_ERROR0(XPATH_STACK_ERROR);
                break;
            }
        case XPATH_OP_ARG:
            if (op->ch1 != -1) {
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	        CHECK_ERROR0;
            }
            if (op->ch2 != -1) {
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	        CHECK_ERROR0;
	    }
            break;
        case XPATH_OP_PREDICATE:
        case XPATH_OP_FILTER:{
                xmlXPathObjectPtr obj;
                xmlNodeSetPtr set;

                /*
                 * Optimization for ()[1] selection i.e. the first elem
                 */
                if ((op->ch1 != -1) && (op->ch2 != -1) &&
#ifdef XP_OPTIMIZED_FILTER_FIRST
		    /*
		    * FILTER TODO: Can we assume that the inner processing
		    *  will result in an ordered list if we have an
		    *  XPATH_OP_FILTER?
		    *  What about an additional field or flag on
		    *  xmlXPathObject like @sorted ? This way we wouldn't need
		    *  to assume anything, so it would be more robust and
		    *  easier to optimize.
		    */
                    ((comp->steps[op->ch1].op == XPATH_OP_SORT) || /* 18 */
		     (comp->steps[op->ch1].op == XPATH_OP_FILTER)) && /* 17 */
#else
		    (comp->steps[op->ch1].op == XPATH_OP_SORT) &&
#endif
                    (comp->steps[op->ch2].op == XPATH_OP_VALUE)) { /* 12 */
                    xmlXPathObjectPtr val;

                    val = comp->steps[op->ch2].value4;
                    if ((val != NULL) && (val->type == XPATH_NUMBER) &&
                        (val->floatval == 1.0)) {
                        xmlNodePtr first = NULL;

                        total +=
                            xmlXPathCompOpEvalFirst(ctxt,
                                                    &comp->steps[op->ch1],
                                                    &first);
			CHECK_ERROR0;
                        /*
                         * The nodeset should be in document order,
                         * Keep only the first value
                         */
                        if ((ctxt->value != NULL) &&
                            (ctxt->value->type == XPATH_NODESET) &&
                            (ctxt->value->nodesetval != NULL) &&
                            (ctxt->value->nodesetval->nodeNr > 1))
                            xmlXPathNodeSetClearFromPos(ctxt->value->nodesetval,
                                                        1, 1);
                        break;
                    }
                }
                /*
                 * Optimization for ()[last()] selection i.e. the last elem
                 */
                if ((op->ch1 != -1) && (op->ch2 != -1) &&
                    (comp->steps[op->ch1].op == XPATH_OP_SORT) &&
                    (comp->steps[op->ch2].op == XPATH_OP_SORT)) {
                    int f = comp->steps[op->ch2].ch1;

                    if ((f != -1) &&
                        (comp->steps[f].op == XPATH_OP_FUNCTION) &&
                        (comp->steps[f].value5 == NULL) &&
                        (comp->steps[f].value == 0) &&
                        (comp->steps[f].value4 != NULL) &&
                        (xmlStrEqual
                         (comp->steps[f].value4, BAD_CAST "last"))) {
                        xmlNodePtr last = NULL;

                        total +=
                            xmlXPathCompOpEvalLast(ctxt,
                                                   &comp->steps[op->ch1],
                                                   &last);
			CHECK_ERROR0;
                        /*
                         * The nodeset should be in document order,
                         * Keep only the last value
                         */
                        if ((ctxt->value != NULL) &&
                            (ctxt->value->type == XPATH_NODESET) &&
                            (ctxt->value->nodesetval != NULL) &&
                            (ctxt->value->nodesetval->nodeTab != NULL) &&
                            (ctxt->value->nodesetval->nodeNr > 1))
                            xmlXPathNodeSetKeepLast(ctxt->value->nodesetval);
                        break;
                    }
                }
		/*
		* Process inner predicates first.
		* Example "index[parent::book][1]":
		* ...
		*   PREDICATE   <-- we are here "[1]"
		*     PREDICATE <-- process "[parent::book]" first
		*       SORT
		*         COLLECT  'parent' 'name' 'node' book
		*           NODE
		*     ELEM Object is a number : 1
		*/
                if (op->ch1 != -1)
                    total +=
                        xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
		CHECK_ERROR0;
                if (op->ch2 == -1)
                    break;
                if (ctxt->value == NULL)
                    break;

                /*
                 * In case of errors, xmlXPathNodeSetFilter can pop additional
                 * nodes from the stack. We have to temporarily remove the
                 * nodeset object from the stack to avoid freeing it
                 * prematurely.
                 */
                CHECK_TYPE0(XPATH_NODESET);
                obj = valuePop(ctxt);
                set = obj->nodesetval;
                if (set != NULL)
                    xmlXPathNodeSetFilter(ctxt, set, op->ch2,
                                          1, set->nodeNr, 1);
                valuePush(ctxt, obj);
                break;
            }
        case XPATH_OP_SORT:
            if (op->ch1 != -1)
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            if ((ctxt->value != NULL) &&
                (ctxt->value->type == XPATH_NODESET) &&
                (ctxt->value->nodesetval != NULL) &&
		(ctxt->value->nodesetval->nodeNr > 1))
	    {
                xmlXPathNodeSetSort(ctxt->value->nodesetval);
	    }
            break;
        default:
            XP_ERROR0(XPATH_INVALID_OPERAND);
            break;
    }

    ctxt->context->depth -= 1;
    return (total);
}